

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

Optional<unsigned_long> __thiscall llvm::DWARFDebugNames::Entry::getCUOffset(Entry *this)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  Optional<unsigned_long> OVar5;
  
  OVar5 = getCUIndex(this);
  if ((((undefined1  [16])OVar5.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     ((ulong)(this->NameIdx->Hdr).super_HeaderPOD.CompUnitCount <= OVar5.Storage.field_0.value)) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar1 = NameIndex::getCUOffset(this->NameIdx,OVar5.Storage.field_0._0_4_);
    uVar2 = uVar1 & 0xff;
    uVar3 = uVar1 & 0xffffffffffffff00;
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  OVar5.Storage.field_0.value = uVar2 | uVar3;
  OVar5.Storage._8_8_ = uVar4;
  return (Optional<unsigned_long>)OVar5.Storage;
}

Assistant:

Optional<uint64_t> DWARFDebugNames::Entry::getCUOffset() const {
  Optional<uint64_t> Index = getCUIndex();
  if (!Index || *Index >= NameIdx->getCUCount())
    return None;
  return NameIdx->getCUOffset(*Index);
}